

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void __thiscall Refal2::CParser::parsingInitial(CParser *this)

{
  int iVar1;
  int iVar2;
  TNumber TVar3;
  code *pcVar4;
  string local_40;
  
  switch((this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.token.type) {
  case TT_None:
    __assert_fail("token.type != TT_None",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Parser.cpp"
                  ,0x1d,"void Refal2::CParser::parsingInitial()");
  case TT_Word:
    CRuleParser::EndFunction((CRuleParser *)this);
    iVar1 = (this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.token.line;
    iVar2 = (this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.token.position;
    TVar3 = (this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.token.number;
    (this->savedToken1).type =
         (this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.token.type;
    (this->savedToken1).line = iVar1;
    (this->savedToken1).position = iVar2;
    (this->savedToken1).number = TVar3;
    (this->savedToken1).word._M_string_length = 0;
    *(this->savedToken1).word._M_dataplus._M_p = '\0';
    std::__cxx11::string::swap
              ((string *)
               &(this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.token.word);
    pcVar4 = parsingWord;
    break;
  case TT_Blank:
    pcVar4 = parsingBlank;
    break;
  default:
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"line should begin with word or space","");
    CErrorsHelper::RaiseError
              ((CErrorsHelper *)this,ES_Error,&local_40,
               &(this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.token);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    pcVar4 = parsingIgnoreLine;
    break;
  case TT_LineFeed:
    goto switchD_001278b6_caseD_8;
  }
  this->state = (TState)pcVar4;
  *(undefined8 *)&this->field_0x1f68 = 0;
switchD_001278b6_caseD_8:
  return;
}

Assistant:

void CParser::parsingInitial()
{
	assert( token.type != TT_None );
	if( token.type == TT_Word ) {
		CRuleParser::EndFunction(); // action
		token.Move( savedToken1 );
		state = &CParser::parsingWord;
	} else if( token.type == TT_Blank ) {
		state = &CParser::parsingBlank;
	} else if( token.type != TT_LineFeed ) {
		error( "line should begin with word or space" );
		state = &CParser::parsingIgnoreLine;
	}
}